

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dropt.c
# Opt level: O2

dropt_char * dropt_get_help(dropt_context *context,dropt_help_params *helpParams)

{
  _Bool _Var1;
  uint uVar2;
  int iVar3;
  dropt_stringstream *ss;
  dropt_char *pdVar4;
  uint uVar5;
  char *pcVar6;
  size_t sVar7;
  uint uVar8;
  dropt_option *option;
  bool bVar9;
  bool bVar10;
  uint local_3c;
  
  ss = dropt_ssopen();
  if (context == (dropt_context *)0x0) {
    dropt_misuse("No dropt context specified.",
                 "/workspace/llm4binary/github/license_c_cmakelists/jamesderlin[P]dropt/src/dropt.c"
                 ,0x333);
  }
  if (ss == (dropt_stringstream *)0x0) {
    return (dropt_char *)0x0;
  }
  if (helpParams == (dropt_help_params *)0x0) {
    local_3c = 2;
    uVar8 = 6;
    bVar9 = false;
  }
  else {
    local_3c = helpParams->indent;
    uVar8 = helpParams->description_start_column;
    bVar9 = helpParams->blank_lines_between_options == '\0';
  }
  option = context->options;
  do {
    _Var1 = is_valid_option(option);
    if (!_Var1) {
      pdVar4 = dropt_ssfinalize(ss);
      return pdVar4;
    }
    pcVar6 = option->long_name;
    if (pcVar6 == (char *)0x0) {
      bVar10 = false;
    }
    else {
      bVar10 = *pcVar6 != '\0';
    }
    if ((option->description != (dropt_char *)0x0) && ((option->attr & 2) == 0)) {
      if ((bool)(option->short_name != '\0' & bVar10)) {
        uVar2 = dropt_ssprintf(ss,"%*s-%c, --%s",(ulong)local_3c,"");
LAB_00102627:
        if ((int)uVar2 < 1) {
          uVar2 = 0;
        }
        if (option->arg_description != (dropt_char *)0x0) {
          pcVar6 = "[=%s]";
          if ((option->attr & 4) == 0) {
            pcVar6 = "=%s";
          }
          iVar3 = dropt_ssprintf(ss,pcVar6);
          if (iVar3 < 1) {
            iVar3 = 0;
          }
          uVar2 = uVar2 + iVar3;
        }
        if (uVar8 <= uVar2) {
          uVar2 = 0;
          dropt_ssprintf(ss,"\n");
        }
        pdVar4 = option->description;
        while (pdVar4 != (char *)0x0) {
          pcVar6 = strchr(pdVar4,10);
          if (pcVar6 == (char *)0x0) {
            sVar7 = strlen(pdVar4);
            pcVar6 = (char *)0x0;
          }
          else {
            sVar7 = (long)pcVar6 - (long)pdVar4;
            pcVar6 = pcVar6 + 1;
          }
          uVar5 = uVar8 - uVar2;
          uVar2 = 0;
          dropt_ssprintf(ss,"%*s%.*s\n",(ulong)uVar5,"",sVar7,pdVar4);
          pdVar4 = pcVar6;
        }
      }
      else {
        if (bVar10) {
          uVar2 = dropt_ssprintf(ss,"%*s--%s",(ulong)local_3c,"",pcVar6);
          goto LAB_00102627;
        }
        if (option->short_name != '\0') {
          uVar2 = dropt_ssprintf(ss,"%*s-%c",(ulong)local_3c,"");
          goto LAB_00102627;
        }
        dropt_ssprintf(ss,"%s\n");
      }
      if (!bVar9) {
        dropt_ssprintf(ss,"\n");
      }
    }
    option = option + 1;
  } while( true );
}

Assistant:

dropt_char*
dropt_get_help(const dropt_context* context,
               const dropt_help_params* helpParams)
{
    dropt_char* helpText = NULL;
    dropt_stringstream* ss = dropt_ssopen();

    if (context == NULL)
    {
        DROPT_MISUSE("No dropt context specified.");
    }
    else if (ss != NULL)
    {
        const dropt_option* option;
        dropt_help_params hp;

        if (helpParams == NULL)
        {
            dropt_init_help_params(&hp);
        }
        else
        {
            hp = *helpParams;
        }

        for (option = context->options; is_valid_option(option); option++)
        {
            bool hasLongName =    option->long_name != NULL
                               && option->long_name[0] != DROPT_TEXT_LITERAL('\0');
            bool hasShortName = option->short_name != DROPT_TEXT_LITERAL('\0');

            /* The number of characters printed on the current line so far. */
            int n;

            if (   option->description == NULL
                || (option->attr & dropt_attr_hidden))
            {
                /* Undocumented option.  Ignore it and move on. */
                continue;
            }
            else if (hasLongName && hasShortName)
            {
                n = dropt_ssprintf(ss, DROPT_TEXT_LITERAL("%*s-%c, --%s"),
                                   hp.indent, DROPT_TEXT_LITERAL(""),
                                   option->short_name, option->long_name);
            }
            else if (hasLongName)
            {
                n = dropt_ssprintf(ss, DROPT_TEXT_LITERAL("%*s--%s"),
                                   hp.indent, DROPT_TEXT_LITERAL(""),
                                   option->long_name);
            }
            else if (hasShortName)
            {
                n = dropt_ssprintf(ss, DROPT_TEXT_LITERAL("%*s-%c"),
                                   hp.indent, DROPT_TEXT_LITERAL(""),
                                   option->short_name);
            }
            else
            {
                /* Comment text.  Don't bother with indentation. */
                assert(option->description != NULL);
                dropt_ssprintf(ss, DROPT_TEXT_LITERAL("%s\n"), option->description);
                goto next;
            }

            if (n < 0) { n = 0; }

            if (option->arg_description != NULL)
            {
                int m = dropt_ssprintf(ss,
                                       (option->attr & dropt_attr_optional_val)
                                       ? DROPT_TEXT_LITERAL("[=%s]")
                                       : DROPT_TEXT_LITERAL("=%s"),
                                       option->arg_description);
                if (m > 0) { n += m; }
            }

            /* Check for equality to make sure that there's at least one
             * space between the option name and its description.
             */
            if ((unsigned int) n >= hp.description_start_column)
            {
                dropt_ssprintf(ss, DROPT_TEXT_LITERAL("\n"));
                n = 0;
            }

            {
                const dropt_char* line = option->description;
                while (line != NULL)
                {
                    int lineLen;
                    const dropt_char* nextLine;
                    const dropt_char* newline = dropt_strchr(line, DROPT_TEXT_LITERAL('\n'));

                    if (newline == NULL)
                    {
                        lineLen = dropt_strlen(line);
                        nextLine = NULL;
                    }
                    else
                    {
                        lineLen = newline - line;
                        nextLine = newline + 1;
                    }

                    dropt_ssprintf(ss, DROPT_TEXT_LITERAL("%*s%.*s\n"),
                                   hp.description_start_column - n, DROPT_TEXT_LITERAL(""),
                                   lineLen, line);
                    n = 0;

                    line = nextLine;
                }
            }

        next:
            if (hp.blank_lines_between_options)
            {
                dropt_ssprintf(ss, DROPT_TEXT_LITERAL("\n"));
            }
        }
        helpText = dropt_ssfinalize(ss);
    }

    return helpText;
}